

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::message_hash::test_method(message_hash *this)

{
  uchar *puVar1;
  uchar *__s;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Span<unsigned_char> output;
  Span<unsigned_char> output_00;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  lazy_ostream local_1e0;
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  uint256 *local_1a0;
  uint256 *local_198;
  char *local_190;
  char *local_188;
  assertion_result local_180;
  uint256 message_hash2;
  uint256 message_hash1;
  uint256 signature_hash;
  string prefixed_message;
  string unsigned_tx;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uint64_t local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  unsigned_tx._M_dataplus._M_p = (pointer)&unsigned_tx.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&unsigned_tx,"...","");
  puVar1 = signature_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  signature_hash.super_base_blob<256U>.m_data._M_elems[8] = '\x01';
  signature_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar1;
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       (byte)MESSAGE_MAGIC_abi_cxx11_._M_string_length;
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &signature_hash,MESSAGE_MAGIC_abi_cxx11_._M_dataplus._M_p,
                     CONCAT71(MESSAGE_MAGIC_abi_cxx11_._M_string_length._1_7_,
                              (byte)MESSAGE_MAGIC_abi_cxx11_._M_string_length));
  local_58._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar4) {
    local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_48._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_58._0_8_ = &local_48;
  }
  else {
    local_48._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  pvVar6 = (iterator)pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  __s = message_hash1.super_base_blob<256U>.m_data._M_elems + 0x10;
  message_hash1.super_base_blob<256U>.m_data._M_elems[8] = '\x01';
  message_hash1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems._0_8_ = __s;
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x10] = (byte)unsigned_tx._M_string_length;
  uVar5 = (iterator)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    uVar5 = local_48._M_allocated_capacity;
  }
  local_58._8_8_ = pvVar6;
  if (((ulong)uVar5 < pvVar6 + 1) && (pvVar6 + 1 < (iterator)0x10)) {
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &message_hash1,0,0,(char *)local_58._0_8_,(size_type)pvVar6);
  }
  else {
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(char *)__s,1);
  }
  local_c8[0] = SUB81(&local_b8,0);
  local_c8._1_7_ = (undefined7)((ulong)&local_b8 >> 8);
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    local_b8._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_b8._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_c8[0] = SUB81(pcVar2,0);
    local_c8._1_7_ = (undefined7)((ulong)pcVar2 >> 8);
    local_b8._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_c8[8] = (undefined1)pbVar3->_M_string_length;
  local_c8._9_7_ = (undefined7)(pbVar3->_M_string_length >> 8);
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     unsigned_tx._M_dataplus._M_p,
                     CONCAT71(unsigned_tx._M_string_length._1_7_,(byte)unsigned_tx._M_string_length)
                    );
  prefixed_message._M_dataplus._M_p = (pointer)&prefixed_message.field_2;
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    prefixed_message.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    prefixed_message.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    prefixed_message.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    prefixed_message._M_dataplus._M_p = pcVar2;
  }
  prefixed_message._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
  }
  if ((uchar *)message_hash1.super_base_blob<256U>.m_data._M_elems._0_8_ != __s) {
    operator_delete((void *)message_hash1.super_base_blob<256U>.m_data._M_elems._0_8_,
                    message_hash1.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  if ((uchar *)signature_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar1) {
    operator_delete((void *)signature_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    signature_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  signature_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = 0;
  local_c8[0] = 0;
  local_c8._1_7_ = 0;
  local_c8[8] = 0;
  local_c8._9_7_ = 0;
  local_68 = 0;
  CSHA256::CSHA256((CSHA256 *)local_c8);
  CSHA256::Write((CSHA256 *)local_c8,(uchar *)unsigned_tx._M_dataplus._M_p,
                 CONCAT71(unsigned_tx._M_string_length._1_7_,(byte)unsigned_tx._M_string_length));
  output.m_size = 0x20;
  output.m_data = (uchar *)&signature_hash;
  CHash256::Finalize((CHash256 *)local_c8,output);
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  message_hash1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = 0;
  local_c8[0] = 0;
  local_c8._1_7_ = 0;
  local_c8[8] = 0;
  local_c8._9_7_ = 0;
  local_68 = 0;
  CSHA256::CSHA256((CSHA256 *)local_c8);
  CSHA256::Write((CSHA256 *)local_c8,(uchar *)prefixed_message._M_dataplus._M_p,
                 prefixed_message._M_string_length);
  output_00.m_size = 0x20;
  output_00.m_data = (uchar *)&message_hash1;
  CHash256::Finalize((CHash256 *)local_c8,output_00);
  MessageHash(&message_hash2,&unsigned_tx);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6a4;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  auVar10[0] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x10] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar10[1] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x11] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar10[2] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x12] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar10[3] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x13] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar10[4] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x14] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar10[5] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x15] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar10[6] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x16] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar10[7] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x17] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar10[8] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x18] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar10[9] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x19] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar10[10] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar10[0xb] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar10[0xc] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar10[0xd] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar10[0xe] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar10[0xf] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  message_hash1.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar8[0] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[0]);
  auVar8[1] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[1] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[1]);
  auVar8[2] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[2] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[2]);
  auVar8[3] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[3] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[3]);
  auVar8[4] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[4] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[4]);
  auVar8[5] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[5] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[5]);
  auVar8[6] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[6] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[6]);
  auVar8[7] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[7] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[7]);
  auVar8[8] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[8] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[8]);
  auVar8[9] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[9] ==
               message_hash1.super_base_blob<256U>.m_data._M_elems[9]);
  auVar8[10] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[10] ==
                message_hash1.super_base_blob<256U>.m_data._M_elems[10]);
  auVar8[0xb] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar8[0xc] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar8[0xd] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar8[0xe] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar8[0xf] = -(message_hash2.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 message_hash1.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar8 = auVar8 & auVar10;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
  local_1c8 = "";
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_188 = "";
  local_b8._8_8_ = &local_198;
  local_198 = &message_hash1;
  local_c8[8] = 0;
  local_c8[0] = 0x18;
  local_c8._1_7_ = 0x13ac6;
  local_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1a0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac618;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_1a0 = &message_hash2;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,&local_1e0,1,2,REQUIRE,0xf74094,(size_t)&local_190,0x6a4,
             (CHash256 *)local_c8,"message_hash2",local_58);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6a5;
  file_00.m_begin = (iterator)&local_1f0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_200,
             msg_00);
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  auVar11[0] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x10] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar11[1] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x11] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar11[2] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x12] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar11[3] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x13] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar11[4] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x14] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar11[5] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x15] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar11[6] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x16] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar11[7] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x17] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar11[8] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x18] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar11[9] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x19] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar11[10] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar11[0xb] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar11[0xc] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar11[0xd] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar11[0xe] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar11[0xf] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  signature_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar9[0] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar9[1] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[1] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar9[2] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[2] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar9[3] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[3] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar9[4] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[4] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar9[5] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[5] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar9[6] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[6] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar9[7] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[7] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar9[8] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[8] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar9[9] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[9] ==
               signature_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar9[10] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[10] ==
                signature_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar9[0xb] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar9[0xc] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar9[0xd] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar9[0xe] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar9[0xf] = -(message_hash1.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 signature_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  auVar9 = auVar9 & auVar11;
  local_c8[0] = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
  local_1c8 = "";
  local_c8[8] = 0;
  local_c8._9_7_ = 0;
  local_b8._M_allocated_capacity = 0;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!(bool)local_c8[0];
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&local_b8._M_allocated_capacity);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_188 = "";
  local_198 = &message_hash1;
  local_c8[8] = 0;
  local_c8[0] = 0x18;
  local_c8._1_7_ = 0x13ac6;
  local_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b8._8_8_ = &local_198;
  local_1a0 = &signature_hash;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac618;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,&local_1e0,1,3,REQUIRE,0xf74094,(size_t)&local_190,0x6a5,local_c8,
             "signature_hash",local_58);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefixed_message._M_dataplus._M_p != &prefixed_message.field_2) {
    operator_delete(prefixed_message._M_dataplus._M_p,
                    prefixed_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unsigned_tx._M_dataplus._M_p != &unsigned_tx.field_2) {
    operator_delete(unsigned_tx._M_dataplus._M_p,unsigned_tx.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_hash)
{
    const std::string unsigned_tx = "...";
    const std::string prefixed_message =
        std::string(1, (char)MESSAGE_MAGIC.length()) +
        MESSAGE_MAGIC +
        std::string(1, (char)unsigned_tx.length()) +
        unsigned_tx;

    const uint256 signature_hash = Hash(unsigned_tx);
    const uint256 message_hash1 = Hash(prefixed_message);
    const uint256 message_hash2 = MessageHash(unsigned_tx);

    BOOST_CHECK_EQUAL(message_hash1, message_hash2);
    BOOST_CHECK_NE(message_hash1, signature_hash);
}